

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall
btSoftBody::appendAnchor
          (btSoftBody *this,int node,btRigidBody *body,bool disableCollisionBetweenLinkedBodies,
          btScalar influence)

{
  btVector3 local;
  btVector3 local_80;
  btTransform local_70;
  
  btTransform::inverse(&local_70,&(body->super_btCollisionObject).m_worldTransform);
  local_80 = btTransform::operator()(&local_70,&(this->m_nodes).m_data[node].m_x);
  appendAnchor(this,node,body,&local_80,disableCollisionBetweenLinkedBodies,influence);
  return;
}

Assistant:

void			btSoftBody::appendAnchor(int node,btRigidBody* body, bool disableCollisionBetweenLinkedBodies,btScalar influence)
{
	btVector3 local = body->getWorldTransform().inverse()*m_nodes[node].m_x;
	appendAnchor(node,body,local,disableCollisionBetweenLinkedBodies,influence);
}